

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFerTron_dns.c
# Opt level: O2

int main(void)

{
  int iVar1;
  undefined8 *__ptr;
  N_Vector u;
  N_Vector u_00;
  N_Vector u_01;
  N_Vector p_Var2;
  long *retvalvalue;
  undefined8 *puVar3;
  void *pvVar4;
  int iVar5;
  int retval;
  SUNContext sunctx;
  void *local_60;
  void *local_58;
  N_Vector local_50;
  void *local_48;
  long *local_40;
  void *local_38;
  
  retval = SUNContext_Create(0,&sunctx);
  iVar5 = 1;
  iVar1 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar1 == 0) {
    __ptr = (undefined8 *)malloc(0x20);
    *__ptr = 0x3fd0000000000000;
    __ptr[1] = 0x3ff8000000000000;
    *(undefined4 *)(__ptr + 2) = 0;
    *(undefined4 *)((long)__ptr + 0x14) = 0x3ff00000;
    *(undefined4 *)(__ptr + 3) = 0x4d12d84a;
    *(undefined4 *)((long)__ptr + 0x1c) = 0x401921fb;
    u = (N_Vector)N_VNew_Serial(6,sunctx);
    iVar1 = check_retval(u,"N_VNew_Serial",0);
    if (iVar1 == 0) {
      u_00 = (N_Vector)N_VNew_Serial(6,sunctx);
      iVar1 = check_retval(u_00,"N_VNew_Serial",0);
      if (iVar1 == 0) {
        u_01 = (N_Vector)N_VNew_Serial(6,sunctx);
        iVar1 = check_retval(u_01,"N_VNew_Serial",0);
        if (iVar1 == 0) {
          p_Var2 = (N_Vector)N_VNew_Serial(6,sunctx);
          iVar1 = check_retval(p_Var2,"N_VNew_Serial",0);
          if (iVar1 == 0) {
            local_50 = p_Var2;
            retvalvalue = (long *)N_VNew_Serial(6,sunctx);
            iVar1 = check_retval(retvalvalue,"N_VNew_Serial",0);
            if (iVar1 == 0) {
              puVar3 = (undefined8 *)N_VGetArrayPointer(u);
              *puVar3 = 0x3fd0000000000000;
              puVar3[1] = 0x3ff8000000000000;
              *(undefined4 *)(puVar3 + 2) = 0;
              *(undefined4 *)((long)puVar3 + 0x14) = 0;
              *(undefined4 *)(puVar3 + 3) = 0;
              *(undefined4 *)((long)puVar3 + 0x1c) = 0xbfe80000;
              *(undefined4 *)(puVar3 + 4) = 0;
              *(undefined4 *)((long)puVar3 + 0x24) = 0;
              *(undefined4 *)(puVar3 + 5) = 0x4d12d84a;
              *(undefined4 *)((long)puVar3 + 0x2c) = 0xc01321fb;
              puVar3 = (undefined8 *)N_VGetArrayPointer(u_00);
              *puVar3 = 0x3fe4000000000000;
              puVar3[1] = 0x400f21fb4d12d84a;
              puVar3[2] = 0x3fd8000000000000;
              puVar3[3] = 0xbfd8000000000000;
              puVar3[4] = 0x400321fb4d12d84a;
              puVar3[5] = 0xc00321fb4d12d84a;
              N_VConst(0,local_50);
              puVar3 = *(undefined8 **)(*retvalvalue + 0x10);
              *puVar3 = 0;
              puVar3[1] = 0;
              *(undefined4 *)(puVar3 + 2) = 0;
              *(undefined4 *)((long)puVar3 + 0x14) = 0x3ff00000;
              *(undefined4 *)(puVar3 + 3) = 0;
              *(undefined4 *)((long)puVar3 + 0x1c) = 0xbff00000;
              *(undefined4 *)(puVar3 + 4) = 0;
              *(undefined4 *)((long)puVar3 + 0x24) = 0x3ff00000;
              *(undefined4 *)(puVar3 + 5) = 0;
              *(undefined4 *)((long)puVar3 + 0x2c) = 0xbff00000;
              local_40 = retvalvalue;
              pvVar4 = (void *)KINCreate(sunctx);
              local_38 = pvVar4;
              iVar1 = check_retval(pvVar4,"KINCreate",0);
              if (iVar1 == 0) {
                retval = KINSetUserData(pvVar4,__ptr);
                iVar5 = 1;
                iVar1 = check_retval(&retval,"KINSetUserData",1);
                if (iVar1 == 0) {
                  retval = KINSetConstraints(pvVar4,local_40);
                  iVar5 = 1;
                  iVar1 = check_retval(&retval,"KINSetConstraints",1);
                  if (iVar1 == 0) {
                    retval = KINSetFuncNormTol(0x88e368f1,pvVar4);
                    iVar5 = 1;
                    iVar1 = check_retval(&retval,"KINSetFuncNormTol",1);
                    if (iVar1 == 0) {
                      retval = KINSetScaledStepTol(0x88e368f1,pvVar4);
                      iVar5 = 1;
                      iVar1 = check_retval(&retval,"KINSetScaledStepTol",1);
                      if (iVar1 == 0) {
                        local_60 = pvVar4;
                        retval = KINInit(pvVar4,func,u_01);
                        iVar5 = 1;
                        iVar1 = check_retval(&retval,"KINInit",1);
                        if (iVar1 == 0) {
                          local_58 = (void *)SUNDenseMatrix(6,6,sunctx);
                          iVar1 = check_retval(local_58,"SUNDenseMatrix",0);
                          if (iVar1 == 0) {
                            local_48 = (void *)SUNLinSol_Dense(u_01,local_58,sunctx);
                            iVar1 = check_retval(local_48,"SUNLinSol_Dense",0);
                            pvVar4 = local_60;
                            if (iVar1 == 0) {
                              retval = KINSetLinearSolver(local_60,local_48,local_58);
                              iVar5 = 1;
                              iVar1 = check_retval(&retval,"KINSetLinearSolver",1);
                              if (iVar1 == 0) {
                                puts("\nFerraris and Tronconi test problem");
                                puts("Tolerance parameters:");
                                printf("  fnormtol  = %10.6g\n  scsteptol = %10.6g\n",0x88e368f1,
                                       0x88e368f1);
                                puts("\n------------------------------------------");
                                puts("\nInitial guess on lower bounds");
                                iVar5 = 0;
                                printf("  [x1,x2] = ");
                                PrintOutput(u);
                                N_VScale(0,u,u_01);
                                SolveIt(pvVar4,u_01,local_50,0,1);
                                N_VScale(0,u,u_01);
                                p_Var2 = local_50;
                                SolveIt(pvVar4,u_01,local_50,1,1);
                                N_VScale(0,u,u_01);
                                SolveIt(local_60,u_01,p_Var2,0,0);
                                N_VScale(0,u,u_01);
                                SolveIt(local_60,u_01,p_Var2,1,0);
                                puts("\n------------------------------------------");
                                puts("\nInitial guess in middle of feasible region");
                                printf("  [x1,x2] = ");
                                PrintOutput(u_00);
                                N_VScale(0,u_00,u_01);
                                SolveIt(local_60,u_01,p_Var2,0,1);
                                N_VScale(0,u_00,u_01);
                                SolveIt(local_60,u_01,p_Var2,1,1);
                                N_VScale(0,u_00,u_01);
                                SolveIt(local_60,u_01,p_Var2,0,0);
                                N_VScale(0,u_00,u_01);
                                SolveIt(local_60,u_01,p_Var2,1,0);
                                N_VDestroy(u);
                                N_VDestroy(u_00);
                                N_VDestroy(u_01);
                                N_VDestroy(p_Var2);
                                N_VDestroy(local_40);
                                KINFree(&local_38);
                                SUNLinSolFree(local_48);
                                SUNMatDestroy(local_58);
                                free(__ptr);
                                SUNContext_Free(&sunctx);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  UserData data;
  sunrealtype fnormtol, scsteptol;
  N_Vector u1, u2, u, s, c;
  int glstr, mset, retval;
  void* kmem;
  SUNMatrix J;
  SUNLinearSolver LS;

  u1 = u2 = u = NULL;
  s = c = NULL;
  kmem  = NULL;
  J     = NULL;
  LS    = NULL;
  data  = NULL;

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* User data */

  data        = (UserData)malloc(sizeof *data);
  data->lb[0] = PT25;
  data->ub[0] = ONE;
  data->lb[1] = ONEPT5;
  data->ub[1] = TWO * PI;

  /* Create serial vectors of length NEQ */
  u1 = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u1, "N_VNew_Serial", 0)) { return (1); }

  u2 = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u2, "N_VNew_Serial", 0)) { return (1); }

  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }

  s = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)s, "N_VNew_Serial", 0)) { return (1); }

  c = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)c, "N_VNew_Serial", 0)) { return (1); }

  SetInitialGuess1(u1, data);
  SetInitialGuess2(u2, data);

  N_VConst(ONE, s); /* no scaling */

  Ith(c, 1) = ZERO; /* no constraint on x1 */
  Ith(c, 2) = ZERO; /* no constraint on x2 */
  Ith(c, 3) = ONE;  /* l1 = x1 - x1_min >= 0 */
  Ith(c, 4) = -ONE; /* L1 = x1 - x1_max <= 0 */
  Ith(c, 5) = ONE;  /* l2 = x2 - x2_min >= 0 */
  Ith(c, 6) = -ONE; /* L2 = x2 - x22_min <= 0 */

  fnormtol  = FTOL;
  scsteptol = STOL;

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  retval = KINSetUserData(kmem, data);
  if (check_retval(&retval, "KINSetUserData", 1)) { return (1); }
  retval = KINSetConstraints(kmem, c);
  if (check_retval(&retval, "KINSetConstraints", 1)) { return (1); }
  retval = KINSetFuncNormTol(kmem, fnormtol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }
  retval = KINSetScaledStepTol(kmem, scsteptol);
  if (check_retval(&retval, "KINSetScaledStepTol", 1)) { return (1); }

  retval = KINInit(kmem, func, u);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* Create dense SUNMatrix */
  J = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)J, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(u, J, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to KINSOL */
  retval = KINSetLinearSolver(kmem, LS, J);
  if (check_retval(&retval, "KINSetLinearSolver", 1)) { return (1); }

  /* Print out the problem size, solution parameters, initial guess. */
  PrintHeader(fnormtol, scsteptol);

  /* --------------------------- */

  printf("\n------------------------------------------\n");
  printf("\nInitial guess on lower bounds\n");
  printf("  [x1,x2] = ");
  PrintOutput(u1);

  N_VScale(ONE, u1, u);
  glstr = KIN_NONE;
  mset  = 1;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u1, u);
  glstr = KIN_LINESEARCH;
  mset  = 1;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u1, u);
  glstr = KIN_NONE;
  mset  = 0;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u1, u);
  glstr = KIN_LINESEARCH;
  mset  = 0;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  printf("\n------------------------------------------\n");
  printf("\nInitial guess in middle of feasible region\n");
  printf("  [x1,x2] = ");
  PrintOutput(u2);

  N_VScale(ONE, u2, u);
  glstr = KIN_NONE;
  mset  = 1;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u2, u);
  glstr = KIN_LINESEARCH;
  mset  = 1;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u2, u);
  glstr = KIN_NONE;
  mset  = 0;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u2, u);
  glstr = KIN_LINESEARCH;
  mset  = 0;
  SolveIt(kmem, u, s, glstr, mset);

  /* Free memory */

  N_VDestroy(u1);
  N_VDestroy(u2);
  N_VDestroy(u);
  N_VDestroy(s);
  N_VDestroy(c);
  KINFree(&kmem);
  SUNLinSolFree(LS);
  SUNMatDestroy(J);
  free(data);
  SUNContext_Free(&sunctx);

  return (0);
}